

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

string * showReason_abi_cxx11_(string *__return_storage_ptr__,Reason r)

{
  ostream *poVar1;
  uint i;
  uint i_00;
  char *pcVar2;
  Clause *c;
  stringstream ss;
  int in_stack_fffffffffffffdfc;
  string local_1f8 [32];
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  switch(r.field_0._0_4_ & 3) {
  case 0:
    if (r.field_0 != (Clause *)0x0) {
      std::operator<<(local_1a8,"clause");
      for (i_00 = 0; i_00 < *(uint *)r.field_0 >> 8; i_00 = i_00 + 1) {
        poVar1 = std::operator<<(local_1a8," ");
        Clause::operator[]((Clause *)r.field_0,i_00);
        getLitString_abi_cxx11_(in_stack_fffffffffffffdfc);
        std::operator<<(poVar1,local_1f8);
        std::__cxx11::string::~string(local_1f8);
      }
      goto LAB_0019b221;
    }
    pcVar2 = "no reason";
    break;
  case 1:
    pcVar2 = "absorbed binary clause?";
    break;
  case 2:
    poVar1 = std::operator<<(local_1a8,"single literal ");
    getLitString_abi_cxx11_(in_stack_fffffffffffffdfc);
    std::operator<<(poVar1,local_1f8);
    goto LAB_0019b1f8;
  case 3:
    poVar1 = std::operator<<(local_1a8,"two literals ");
    getLitString_abi_cxx11_(in_stack_fffffffffffffdfc);
    poVar1 = std::operator<<(poVar1,local_1f8);
    poVar1 = std::operator<<(poVar1," & ");
    getLitString_abi_cxx11_(in_stack_fffffffffffffdfc);
    std::operator<<(poVar1,local_1d8);
    std::__cxx11::string::~string(local_1d8);
LAB_0019b1f8:
    std::__cxx11::string::~string(local_1f8);
    goto LAB_0019b221;
  }
  std::operator<<(local_1a8,pcVar2);
LAB_0019b221:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string showReason(Reason r) {
	std::stringstream ss;
	switch (r.type()) {
		case 0:
			if (r.pt() == nullptr) {
				ss << "no reason";
			} else {
				Clause& c = *r.pt();
				ss << "clause";
				for (unsigned int i = 0; i < c.size(); i++) {
					ss << " " << getLitString(toInt(~c[i]));
				}
			}
			break;
		case 1:
			ss << "absorbed binary clause?";
			break;
		case 2:
			ss << "single literal " << getLitString(toInt(~toLit(r.d1())));
			break;
		case 3:
			ss << "two literals " << getLitString(toInt(~toLit((r.d1())))) << " & "
				 << getLitString(toInt(~toLit((r.d2()))));
			break;
		default:
			assert(false);
	}
	return ss.str();
}